

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O3

bool processCmd(string *cmd)

{
  int iVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  int *piVar5;
  longlong lVar6;
  bool bVar7;
  undefined1 *puVar8;
  char *pcVar9;
  string *psVar10;
  long lVar11;
  undefined1 auVar12 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  string sourcePath;
  path p;
  string possibleCmds [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  char *local_198;
  long local_190;
  char local_188 [16];
  undefined1 *local_178;
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"put","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"read","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"mkdir","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"put2","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"read2","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"quit","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"fetch","");
  puVar8 = local_48;
  local_58[0] = puVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"fetch2","");
  split(&local_1b0,cmd,' ');
  iVar4 = std::__cxx11::string::compare
                    ((string *)
                     local_1b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (iVar4 == 0) {
    type = put;
    if ((long)local_1b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
LAB_0010f0a1:
      lVar11 = 0x1b;
      pcVar9 = "Usage: put source_file_path";
      goto LAB_0010f35a;
    }
    local_198 = local_188;
    pcVar2 = local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar2,
               pcVar2 + local_1b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    std::ifstream::open((string *)ifs,(_Ios_Openmode)&local_198);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: the input file does not exist",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
    }
    else {
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char*>((string *)local_158,local_198,local_198 + local_190)
      ;
      boost::filesystem::path::filename();
      std::__cxx11::string::_M_append((char *)&desFileName_abi_cxx11_,(ulong)local_178);
      if (local_178 != local_168) {
        operator_delete(local_178);
      }
      if (local_158[0] != local_148) {
        operator_delete(local_158[0]);
      }
    }
LAB_0010f13f:
    if (local_198 != local_188) {
      operator_delete(local_198);
    }
    if (cVar3 != '\0') goto LAB_0010f455;
  }
  else {
    iVar4 = std::__cxx11::string::compare
                      ((string *)
                       local_1b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar4 == 0) {
      type = read;
      if ((long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x80) {
        lVar11 = 0x20;
        pcVar9 = "Usage: read file_id offset count";
        goto LAB_0010f35a;
      }
      pcVar9 = local_1b0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      piVar5 = __errno_location();
      iVar4 = *piVar5;
      *piVar5 = 0;
      lVar11 = strtol(pcVar9,&local_198,10);
      if (local_198 == pcVar9) {
        std::__throw_invalid_argument("stoi");
LAB_0010f4d8:
        std::__throw_out_of_range("stoi");
LAB_0010f4e4:
        std::__throw_invalid_argument("stoll");
LAB_0010f4f0:
        std::__throw_invalid_argument("stoi");
      }
      else {
        if (((int)lVar11 != lVar11) || (*piVar5 == 0x22)) goto LAB_0010f4d8;
        if (*piVar5 == 0) {
          *piVar5 = iVar4;
        }
        pcVar9 = local_1b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        iVar4 = *piVar5;
        read_fileId = (int)lVar11;
        *piVar5 = 0;
        lVar6 = strtoll(pcVar9,&local_198,10);
        if (local_198 == pcVar9) goto LAB_0010f4e4;
        iVar1 = *piVar5;
        if (iVar1 == 0) {
          *piVar5 = iVar4;
        }
        else {
          iVar4 = iVar1;
          if (iVar1 == 0x22) {
            std::__throw_out_of_range("stoll");
            goto LAB_0010f0a1;
          }
        }
        pcVar9 = local_1b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
        read_offset = lVar6;
        *piVar5 = 0;
        lVar11 = strtol(pcVar9,&local_198,10);
        if (local_198 == pcVar9) goto LAB_0010f4f0;
        if ((0xfffffffeffffffff < lVar11 - 0x80000000U) && (*piVar5 != 0x22)) {
          if (*piVar5 == 0) {
            *piVar5 = iVar4;
          }
LAB_0010f44f:
          read_count = (int)lVar11;
          goto LAB_0010f455;
        }
      }
      std::__throw_out_of_range("stoi");
LAB_0010f508:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Bye: Exit miniDFS",0x11);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      exit(0);
    }
    iVar4 = std::__cxx11::string::compare
                      ((string *)
                       local_1b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar4 == 0) {
      type = mkdir;
      if ((long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x40) {
        psVar10 = &mkdir_path_abi_cxx11_;
LAB_0010f0de:
        std::__cxx11::string::_M_assign((string *)psVar10);
        goto LAB_0010f455;
      }
      lVar11 = 0x13;
      pcVar9 = "Usage: mkdir folder";
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((string *)
                         local_1b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare
                          ((string *)
                           local_1b0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare
                            ((string *)
                             local_1b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if (iVar4 == 0) goto LAB_0010f508;
          iVar4 = std::__cxx11::string::compare
                            ((string *)
                             local_1b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if (iVar4 == 0) {
            type = fetch;
            if ((long)local_1b0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x60) {
              lVar11 = 0x1e;
              pcVar9 = "Usage: fetch file_id save_path";
              goto LAB_0010f4af;
            }
            fetch_id = std::__cxx11::stoi(local_1b0.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1,
                                          (size_t *)0x0,10);
            std::__cxx11::string::_M_assign((string *)&fetch_savepath_abi_cxx11_);
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((string *)
                               local_1b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            if (iVar4 == 0) {
              type = fetch2;
              if ((long)local_1b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x60) {
                std::__cxx11::string::_M_assign((string *)&fetch_filepath_abi_cxx11_);
                psVar10 = &fetch_savepath_abi_cxx11_;
                goto LAB_0010f0de;
              }
              lVar11 = 0x21;
              pcVar9 = "Usage: fetch2 file_path save_path";
LAB_0010f4af:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar9,lVar11);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              goto LAB_0010f394;
            }
          }
LAB_0010f455:
          bVar7 = true;
          goto LAB_0010f457;
        }
        type = read2;
        if ((long)local_1b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x80) {
          lVar11 = 0x23;
          pcVar9 = "Usage: read2 file_path offset count";
          goto LAB_0010f35a;
        }
        std::__cxx11::string::_M_assign((string *)&read_filename_abi_cxx11_);
        pcVar9 = local_1b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        *piVar5 = 0;
        lVar6 = strtoll(pcVar9,&local_198,10);
        if (local_198 == pcVar9) {
          std::__throw_invalid_argument("stoll");
LAB_0010f53f:
          std::__throw_invalid_argument("stoi");
        }
        else {
          iVar1 = *piVar5;
          if (iVar1 == 0) {
            *piVar5 = iVar4;
          }
          else {
            iVar4 = iVar1;
            if (iVar1 == 0x22) {
              std::__throw_out_of_range("stoll");
              goto LAB_0010f2ef;
            }
          }
          pcVar9 = local_1b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          read_offset = lVar6;
          *piVar5 = 0;
          lVar11 = strtol(pcVar9,&local_198,10);
          if (local_198 == pcVar9) goto LAB_0010f53f;
          if (((int)lVar11 == lVar11) && (*piVar5 != 0x22)) {
            if (*piVar5 == 0) {
              *piVar5 = iVar4;
            }
            goto LAB_0010f44f;
          }
        }
        auVar12 = std::__throw_out_of_range("stoi");
        if (auVar12._8_4_ != 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1b0);
          lVar11 = -0x100;
          do {
            if (puVar8 != *(undefined1 **)(puVar8 + -0x10)) {
              operator_delete(*(undefined1 **)(puVar8 + -0x10));
            }
            puVar8 = puVar8 + -0x20;
            lVar11 = lVar11 + 0x20;
          } while (lVar11 != 0);
          _Unwind_Resume(auVar12._0_8_);
        }
        __cxa_begin_catch(auVar12._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: id isn\'t a number",0x18);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        __cxa_end_catch();
        goto LAB_0010f394;
      }
      type = put2;
      if ((long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x60) {
        local_198 = local_188;
        pcVar2 = local_1b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar2,
                   pcVar2 + local_1b0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        std::ifstream::open((string *)ifs,(_Ios_Openmode)&local_198);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: the input file does not exist",0x24);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
          std::ostream::put('0');
          std::ostream::flush();
        }
        else {
          std::__cxx11::string::_M_assign((string *)&desFileName_abi_cxx11_);
        }
        goto LAB_0010f13f;
      }
LAB_0010f2ef:
      lVar11 = 0x2c;
      pcVar9 = "Usage: put2 source_file_path des_file_folder";
    }
LAB_0010f35a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar11);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
LAB_0010f394:
  bVar7 = false;
LAB_0010f457:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  lVar11 = 0;
  do {
    if (local_48 + lVar11 != *(undefined1 **)((long)local_58 + lVar11)) {
      operator_delete(*(undefined1 **)((long)local_58 + lVar11));
    }
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x100);
  return bVar7;
}

Assistant:

bool processCmd(const string& cmd)
{
    string possibleCmds[] = {"put", "read", "mkdir", "put2", "read2", "quit", "fetch", "fetch2"};

    vector<string> x = split(cmd, ' ');
    if (x[0].compare(possibleCmds[0]) == 0)
    {
        type = MsgType::put;
        if (x.size() != 2)
        {
            cerr << "Usage: put source_file_path" << endl;
            return false;
        }
        string sourcePath = x[1];
        ifs.open(sourcePath);
        if (! ifs.is_open())
        {
            cerr << "Error: the input file does not exist" << endl;
            return false;
        }

        boost::filesystem::path p(sourcePath);

        desFileName += p.filename().string();

    }
    else if (x[0].compare(possibleCmds[1]) == 0)
    {
        type = MsgType::read;
        if (x.size() != 4)
        {
            cerr << "Usage: read file_id offset count" << endl;
            return false;
        }

        try {
            read_fileId = stoi(x[1]);
            read_offset = stoll(x[2]);
            read_count = stoi(x[3]);
        }
        catch (exception& e)
        {
            std::cout << "Error: id, offset or count isn't a number" << std::endl;
            return false;
        }

    }
    else if(x[0].compare(possibleCmds[2]) == 0){
        type = MsgType::mkdir;
        if (x.size() != 2)
        {
            cerr << "Usage: mkdir folder" << endl;
            return false;
        }
        mkdir_path = x[1];

    }
    else if(x[0].compare(possibleCmds[3]) == 0)
    {
        type = MsgType::put2;
        if (x.size() != 3)
        {
            cerr << "Usage: put2 source_file_path des_file_folder" << endl;
            return false;
        }
        string sourcePath = x[1];
        ifs.open(sourcePath);
        if (! ifs.is_open())
        {
            cerr << "Error: the input file does not exist" << endl;
            return false;
        }

        desFileName = x[2];

    }
    else if (x[0].compare(possibleCmds[4]) == 0)
    {
        type = MsgType::read2;
        if (x.size() != 4)
        {
            cerr << "Usage: read2 file_path offset count" << endl;
            return false;
        }

        read_filename = x[1];

        try {
            read_offset = stoll(x[2]);
            read_count = stoi(x[3]);
        }
        catch (exception& e)
        {
            std::cout << "Error: offset or count isn't a number" << std::endl;
            return false;
        }

    }
    else if (x[0].compare(possibleCmds[5]) == 0)
    {
        cout << "Bye: Exit miniDFS" << endl;
        exit(0);
    }
    else if (x[0].compare(possibleCmds[6]) == 0)
    {
        type = MsgType::fetch;
        // fetch files
        if (x.size() != 3)
        {
            cerr << "Usage: fetch file_id save_path" << endl;
            return false;
        }

        try {
            fetch_id = stoi(x[1]);
            fetch_savepath = x[2];
        }
        catch (exception& e)
        {
            std::cout << "Error: id isn't a number" << std::endl;
            return false;
        }

    }
    else if (x[0].compare(possibleCmds[7]) == 0)
    {
        type = MsgType::fetch2;
        // fetch files
        if (x.size() != 3)
        {
            cerr << "Usage: fetch2 file_path save_path" << endl;
            return false;
        }

        fetch_filepath = x[1];
        fetch_savepath = x[2];
    }

    return true;
}